

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

bool __thiscall cmCTestRunProcess::StartProcess(cmCTestRunProcess *this)

{
  double timeout;
  int iVar1;
  pointer pbVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  char **local_48;
  iterator iStack_40;
  char **local_38;
  char *local_30;
  
  local_48 = (char **)0x0;
  iStack_40._M_current = (char **)0x0;
  local_38 = (char **)0x0;
  pbVar2 = (this->CommandLineStrings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar2 != (this->CommandLineStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_30 = (pbVar2->_M_dataplus)._M_p;
      if (iStack_40._M_current == local_38) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_48,iStack_40,&local_30)
        ;
      }
      else {
        *iStack_40._M_current = local_30;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != (this->CommandLineStrings).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    local_30 = (char *)0x0;
    if (iStack_40._M_current != local_38) {
      *iStack_40._M_current = (char *)0x0;
      iStack_40._M_current = iStack_40._M_current + 1;
      goto LAB_002ba250;
    }
  }
  local_30 = (char *)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_48,iStack_40,&local_30);
LAB_002ba250:
  cmsysProcess_SetCommand(this->Process,local_48);
  if ((this->WorkingDirectory)._M_string_length != 0) {
    cmsysProcess_SetWorkingDirectory(this->Process,(this->WorkingDirectory)._M_dataplus._M_p);
  }
  cmsysProcess_SetOption(this->Process,0,1);
  timeout = this->TimeOut;
  if ((timeout != -1.0) || (NAN(timeout))) {
    cmsysProcess_SetTimeout(this->Process,timeout);
  }
  cmsysProcess_Execute(this->Process);
  iVar1 = cmsysProcess_GetState(this->Process);
  this->PipeState = iVar1;
  if (local_48 != (char **)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  return iVar1 - 3U < 2;
}

Assistant:

bool StartProcess()
  {
    std::vector<const char*> args;
    for (std::vector<std::string>::iterator i =
           this->CommandLineStrings.begin();
         i != this->CommandLineStrings.end(); ++i) {
      args.push_back(i->c_str());
    }
    args.push_back(CM_NULLPTR); // null terminate
    cmsysProcess_SetCommand(this->Process, &*args.begin());
    if (!this->WorkingDirectory.empty()) {
      cmsysProcess_SetWorkingDirectory(this->Process,
                                       this->WorkingDirectory.c_str());
    }

    cmsysProcess_SetOption(this->Process, cmsysProcess_Option_HideWindow, 1);
    if (this->TimeOut != -1) {
      cmsysProcess_SetTimeout(this->Process, this->TimeOut);
    }
    cmsysProcess_Execute(this->Process);
    this->PipeState = cmsysProcess_GetState(this->Process);
    // if the process is running or exited return true
    return this->PipeState == cmsysProcess_State_Executing ||
      this->PipeState == cmsysProcess_State_Exited;
  }